

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O0

void __thiscall tchecker::syncprod::synchronizer_t::process(synchronizer_t *this)

{
  attributes_t local_48;
  synchronizer_t *local_10;
  synchronizer_t *this_local;
  
  local_48._map._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  local_48._map._M_h._M_rehash_policy._4_4_ = 0;
  local_48._map._M_h._M_rehash_policy._M_next_resize = 0;
  local_48._map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_48._map._M_h._M_element_count = 0;
  local_48._map._M_h._M_buckets = (__buckets_ptr)0x0;
  local_48._map._M_h._M_bucket_count = 0;
  local_48._map._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_10 = this;
  tchecker::system::attributes_t::attributes_t(&local_48);
  tchecker::system::processes_t::add_process
            (&(this->_product).super_processes_t,&this->_process_name,&local_48);
  tchecker::system::attributes_t::~attributes_t(&local_48);
  return;
}

Assistant:

void process() { _product.add_process(_process_name); }